

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O0

void __thiscall
printable_vtable::printable_vtable<large_printable>(printable_vtable *this,large_printable *value)

{
  large_printable *this_00;
  large_printable *value_local;
  printable_vtable *this_local;
  
  (this->vtable_)._M_elems[2] = print_wrapper<large_printable>::exec;
  (this->vtable_)._M_elems[0] = clone_impl<large_printable>;
  (this->vtable_)._M_elems[1] = delete_impl<large_printable>;
  this->get_value_ptr_ = get_value_ptr<true>;
  this->value_ = (void *)0x0;
  this_00 = (large_printable *)operator_new(0x2018);
  large_printable::large_printable(this_00,value);
  this->value_ = this_00;
  return;
}

Assistant:

printable_vtable (T value) :
        vtable_ ({
            (void_function_type)(&clone_impl<T>),
            (void_function_type)(&delete_impl<T>),
            (void_function_type)(&print_wrapper<T>::exec)
        }),
        get_value_ptr_ (&get_value_ptr<sizeof(value_) < sizeof(T)>),
        value_ (0)
    {
        if (sizeof(T) <= sizeof(value_))
            new (&value_) T(std::move(value));
        else
            value_ = new T(std::move(value));
    }